

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

void __thiscall TxConfirmStats::ClearCurrent(TxConfirmStats *this,uint nBlockHeight)

{
  int iVar1;
  long lVar2;
  size_type sVar3;
  vector<int,_std::allocator<int>_> *this_00;
  reference pvVar4;
  uint in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  uint j;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  undefined4 local_18;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0;
  while( true ) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(in_stack_ffffffffffffffa8);
    if (sVar3 <= local_18) break;
    sVar3 = in_RDI + 0x80;
    this_00 = (vector<int,_std::allocator<int>_> *)(ulong)in_ESI;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_ffffffffffffffa8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)this_00,sVar3);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,sVar3);
    iVar1 = *pvVar4;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,sVar3);
    *pvVar4 = iVar1 + *pvVar4;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::size((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)in_stack_ffffffffffffffa8);
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::operator[]((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)this_00,sVar3);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](this_00,sVar3);
    *pvVar4 = 0;
    local_18 = local_18 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TxConfirmStats::ClearCurrent(unsigned int nBlockHeight)
{
    for (unsigned int j = 0; j < buckets.size(); j++) {
        oldUnconfTxs[j] += unconfTxs[nBlockHeight % unconfTxs.size()][j];
        unconfTxs[nBlockHeight%unconfTxs.size()][j] = 0;
    }
}